

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int get_drl_cost(MB_MODE_INFO *mbmi,MB_MODE_INFO_EXT *mbmi_ext,int (*drl_mode_cost0) [2],
                int8_t ref_frame_type)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  bVar1 = mbmi->mode;
  iVar6 = 0;
  if (bVar1 < 0x19) {
    if ((0x644000U >> (bVar1 & 0x1f) & 1) == 0) {
      iVar6 = 0;
      if ((0x1010000U >> (bVar1 & 0x1f) & 1) != 0) {
        iVar2 = 0;
        iVar6 = 0;
        do {
          uVar5 = iVar2 - 1;
          do {
            uVar3 = uVar5;
            if (uVar3 == 1) {
              return iVar6;
            }
            uVar5 = uVar3 + 1;
          } while ((uint)mbmi_ext->ref_mv_count[ref_frame_type] <= uVar3 + 2);
          bVar1 = av1_drl_ctx(mbmi_ext->weight[ref_frame_type],uVar5);
          uVar4 = *(ushort *)&mbmi->field_0xa7 >> 4 & 3;
          iVar6 = iVar6 + drl_mode_cost0[bVar1][uVar4 != uVar5];
          iVar2 = uVar3 + 2;
        } while (uVar4 != uVar5);
      }
    }
    else {
      iVar6 = 0;
      uVar5 = 1;
      do {
        do {
          uVar3 = uVar5;
          if (uVar3 == 3) {
            return iVar6;
          }
          uVar5 = uVar3 + 1;
        } while (mbmi_ext->ref_mv_count[ref_frame_type] <= uVar5);
        bVar1 = av1_drl_ctx(mbmi_ext->weight[ref_frame_type],uVar3);
        uVar3 = (*(ushort *)&mbmi->field_0xa7 >> 4 & 3) + 2;
        iVar6 = iVar6 + drl_mode_cost0[bVar1][uVar3 != uVar5];
      } while (uVar3 != uVar5);
    }
  }
  return iVar6;
}

Assistant:

static inline int get_drl_cost(const MB_MODE_INFO *mbmi,
                               const MB_MODE_INFO_EXT *mbmi_ext,
                               const int (*const drl_mode_cost0)[2],
                               int8_t ref_frame_type) {
  int cost = 0;
  if (mbmi->mode == NEWMV || mbmi->mode == NEW_NEWMV) {
    for (int idx = 0; idx < 2; ++idx) {
      if (mbmi_ext->ref_mv_count[ref_frame_type] > idx + 1) {
        uint8_t drl_ctx = av1_drl_ctx(mbmi_ext->weight[ref_frame_type], idx);
        cost += drl_mode_cost0[drl_ctx][mbmi->ref_mv_idx != idx];
        if (mbmi->ref_mv_idx == idx) return cost;
      }
    }
    return cost;
  }

  if (have_nearmv_in_inter_mode(mbmi->mode)) {
    for (int idx = 1; idx < 3; ++idx) {
      if (mbmi_ext->ref_mv_count[ref_frame_type] > idx + 1) {
        uint8_t drl_ctx = av1_drl_ctx(mbmi_ext->weight[ref_frame_type], idx);
        cost += drl_mode_cost0[drl_ctx][mbmi->ref_mv_idx != (idx - 1)];
        if (mbmi->ref_mv_idx == (idx - 1)) return cost;
      }
    }
    return cost;
  }
  return cost;
}